

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O2

double wolfe_eval<dense_parameters>
                 (vw *all,bfgs *b,float *mem,double loss_sum,double previous_loss_sum,
                 double step_size,double importance_weight_sum,int *origin,double *wolfe1,
                 dense_parameters *weights)

{
  undefined8 uVar1;
  byte bVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  bVar2 = (byte)weights->_stride_shift;
  dVar4 = 0.0;
  dVar5 = 0.0;
  dVar6 = 0.0;
  dVar7 = 0.0;
  for (lVar3 = 0; weights->_weight_mask * 4 + 4 != lVar3; lVar3 = lVar3 + (1L << (bVar2 & 0x3f)) * 4
      ) {
    uVar1 = *(undefined8 *)((long)weights->_begin + lVar3 + 4);
    dVar8 = (double)(float)uVar1;
    dVar9 = (double)(float)((ulong)uVar1 >> 0x20);
    dVar4 = dVar4 + dVar8 * dVar8;
    dVar5 = dVar5 + dVar8 * dVar9;
    dVar6 = dVar6 + dVar8 * dVar8 * (double)*(float *)((long)weights->_begin + lVar3 + 0xc);
    dVar7 = dVar7 + dVar9 * (double)mem[((ulong)(lVar3 >> 2) >> (bVar2 & 0x3f)) *
                                        (long)b->mem_stride + (long)(*origin % b->mem_stride)];
  }
  dVar8 = (loss_sum - previous_loss_sum) / (dVar7 * step_size);
  *wolfe1 = dVar8;
  if (all->quiet == false) {
    fprintf(_stderr,"%-10.5f\t%-10.5f\t%s%-10f\t%-10f\t",
            dVar4 / (importance_weight_sum * importance_weight_sum),dVar6 / importance_weight_sum,
            dVar8,dVar5 / dVar7," ");
  }
  return step_size * 0.5;
}

Assistant:

double wolfe_eval(vw& all, bfgs& b, float* mem, double loss_sum, double previous_loss_sum, double step_size,
    double importance_weight_sum, int& origin, double& wolfe1, T& weights)
{
  double g0_d = 0.;
  double g1_d = 0.;
  double g1_Hg1 = 0.;
  double g1_g1 = 0.;

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    float* mem1 = mem + (w.index() >> weights.stride_shift()) * b.mem_stride;
    g0_d += ((double)mem1[(MEM_GT + origin) % b.mem_stride]) * ((&(*w))[W_DIR]);
    g1_d += ((double)(&(*w))[W_GT]) * (&(*w))[W_DIR];
    g1_Hg1 += ((double)(&(*w))[W_GT]) * (&(*w))[W_GT] * ((&(*w))[W_COND]);
    g1_g1 += ((double)(&(*w))[W_GT]) * (&(*w))[W_GT];
  }

  wolfe1 = (loss_sum - previous_loss_sum) / (step_size * g0_d);
  double wolfe2 = g1_d / g0_d;
  // double new_step_cross = (loss_sum-previous_loss_sum-g1_d*step)/(g0_d-g1_d);

  if (!all.quiet)
    fprintf(stderr, "%-10.5f\t%-10.5f\t%s%-10f\t%-10f\t", g1_g1 / (importance_weight_sum * importance_weight_sum),
        g1_Hg1 / importance_weight_sum, " ", wolfe1, wolfe2);
  return 0.5 * step_size;
}